

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockNode.cpp
# Opt level: O2

void __thiscall LockNode::LockNode(LockNode *this,Instruction *instruction,CallInst *callInst)

{
  _Rb_tree_header *p_Var1;
  
  Node::Node(&this->super_Node,LOCK,instruction,callInst);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__LockNode_0013ab40;
  p_Var1 = &(this->correspondingUnlocks_)._M_t._M_impl.super__Rb_tree_header;
  (this->correspondingUnlocks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->correspondingUnlocks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->correspondingUnlocks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->correspondingUnlocks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->correspondingUnlocks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

LockNode::LockNode(const llvm::Instruction *instruction,
                   const llvm::CallInst *callInst)
        : Node(NodeType::LOCK, instruction, callInst) {}